

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O3

int to_base64(char *str,size_t str_len,size_t out_len)

{
  char cVar1;
  uint uVar2;
  void *__ptr;
  long lVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  
  __ptr = malloc(((str_len * 4) / 3 + 3 & 0xfffffffffffffffc) + 1);
  if (__ptr == (void *)0x0) {
    iVar6 = -1;
    if (-1 < msgno) {
      to_base64_cold_1();
    }
  }
  else {
    if (str_len == 0) {
      uVar8 = 0;
    }
    else {
      iVar6 = 0;
      uVar8 = 0;
      uVar7 = 0;
      sVar9 = 0;
      do {
        cVar1 = str[sVar9];
        uVar8 = uVar8 << 8 | (int)cVar1;
        if (iVar6 < -2) {
          iVar6 = iVar6 + 8;
        }
        else {
          pcVar10 = (char *)((long)(int)uVar7 + (long)__ptr);
          uVar2 = iVar6 + 0xe;
          do {
            uVar5 = uVar2;
            *pcVar10 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                       [(int)uVar8 >> ((char)uVar5 - 0xcU & 0x1f) & 0x3f];
            pcVar10 = pcVar10 + 1;
            uVar7 = uVar7 + 1;
            uVar2 = uVar5 - 6;
          } while (0xb < uVar5 - 6);
          iVar6 = uVar5 - 0xc;
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != str_len);
      if (0 < iVar6) {
        lVar3 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        *(char *)((long)__ptr + lVar3) =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(int)cVar1 << (6U - (char)iVar6 & 0x1f) & 0x3f];
      }
      uVar8 = uVar7;
      if ((uVar7 & 3) != 0) {
        memset((void *)((long)__ptr + (long)(int)uVar7),0x3d,(ulong)(4 - (uVar7 & 3)));
        uVar8 = (uVar7 | 3) + 1;
        do {
          uVar7 = uVar7 + 1;
        } while ((uVar7 & 3) != 0);
      }
    }
    if ((ulong)(long)(int)uVar8 < out_len) {
LAB_00101bad:
      free(__ptr);
      iVar6 = -1;
    }
    else {
      if (out_len == 0) {
        out_len = 0;
      }
      else {
        sVar9 = 0;
        do {
          cVar1 = *(char *)((long)__ptr + sVar9);
          cVar4 = '.';
          if ((cVar1 != '+') && (cVar4 = cVar1, cVar1 == '=')) goto LAB_00101bad;
          str[sVar9] = cVar4;
          sVar9 = sVar9 + 1;
        } while (out_len != sVar9);
      }
      iVar6 = (int)out_len;
      free(__ptr);
    }
  }
  return iVar6;
}

Assistant:

static int
to_base64(char *str, size_t str_len, const size_t out_len)
{
    char *b = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    char *buffer;
    size_t i;
    int n = 0, x = 0, l = 0;

    buffer = (char *)malloc(((str_len * 4 / 3 + 3) & ~0x03) + 1);
    if (!buffer) {
        msg_error(hash, "memory allocate\n");
        return -1;
    }

    for (i = 0; i < str_len; i++) {
        x = x << 8 | str[i];
        for (l += 8; l >= 6; l -= 6) {
            buffer[n++] = b[(x >> (l - 6)) & 0x3f];
        }
    }

    if (l > 0) {
        x <<= 6 - l;
        buffer[n++] = b[x & 0x3f];
    }

    for (; n % 4;) {
        buffer[n++] = '=';
    }

    if ((size_t)n < out_len) {
        free(buffer);
        return -1;
    }

    for (i = 0; i < out_len; i++) {
        if (buffer[i] == '+') {
            str[i] = '.';
        } else if (buffer[i] == '=') {
            free(buffer);
            return -1;
        } else {
            str[i] = buffer[i];
        }
    }

    free(buffer);

    return i;
}